

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O2

ostream * plot::detail::
          output_hbox_line<std::tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>,std::tuple<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,0ul>
                    (ostream *stream,size_t margin,
                    block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                    *lines,block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                           *ends,
                    _Head_base<2UL,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&,_false>
                    blocks)

{
  bool bVar1;
  ostream *poVar2;
  Size SVar3;
  tuple<const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
  local_48;
  
  bVar1 = block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          ::operator!=((block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                        *)(lines + 1),
                       (block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                        *)(ends + 1));
  if (bVar1) {
    poVar2 = operator<<(stream,(value_type *)(lines + 1));
  }
  else {
    SVar3 = VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
            ::size((VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                    *)(blocks._M_head_impl + 1));
    *(long *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = (long)(int)SVar3.x;
    poVar2 = std::operator<<(stream,"");
  }
  local_48.
  super__Tuple_impl<0UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
  .
  super__Tuple_impl<1UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
  .super__Tuple_impl<2UL,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>.
  super__Head_base<2UL,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&,_false>.
  _M_head_impl = (_Head_base<2UL,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&,_false>
                  )(_Head_base<2UL,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&,_false>
                    )blocks._M_head_impl;
  local_48.
  super__Tuple_impl<0UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
  .
  super__Tuple_impl<1UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
  .
  super__Head_base<1UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_false>
  ._M_head_impl = ends;
  local_48.
  super__Tuple_impl<0UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
  .
  super__Head_base<0UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_false>
  ._M_head_impl = lines;
  poVar2 = output_hbox_line<std::tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>>
                     (poVar2,margin,&local_48);
  return poVar2;
}

Assistant:

inline std::ostream& output_hbox_line(std::ostream& stream,
                                          std::size_t margin,
                                          Iterators const& lines,
                                          Iterators const& ends,
                                          Blocks const& blocks,
                                          std::index_sequence<N...>) {
        return output_hbox_line(
            ((std::get<0>(lines) != std::get<0>(ends))
                ? stream << *std::get<0>(lines)
                : stream << std::setw(detail::block_traits<std::decay_t<std::tuple_element_t<0, Blocks>>>
                    ::size(std::get<0>(blocks)).x) << u8""),
            margin, std::forward_as_tuple(std::get<N+1>(lines), std::get<N+1>(ends), std::get<N+1>(blocks))...);
    }